

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models.cpp
# Opt level: O0

void gl_RenderFrameModels
               (FSpriteModelFrame *smf,FState *curState,int curTics,PClass *ti,
               Matrix3x4 *normaltransform,int translation)

{
  FModel *this;
  bool bVar1;
  FModel **ppFVar2;
  float fVar3;
  FTexture *local_88;
  FTexture *tex;
  FModel *mdl;
  int i;
  FState *prevState;
  float time;
  float ticFraction;
  FState *nextState;
  double inter;
  FSpriteModelFrame *smfNext;
  int translation_local;
  Matrix3x4 *normaltransform_local;
  PClass *ti_local;
  int curTics_local;
  FState *curState_local;
  FSpriteModelFrame *smf_local;
  
  inter = 0.0;
  nextState = (FState *)0x0;
  bVar1 = FBoolCVar::operator_cast_to_bool(&gl_interpolate_model_frames);
  if ((((bVar1) && ((smf->flags & 0x10) == 0)) &&
      (_time = FState::GetNextState(curState), curState != _time)) && (_time != (FState *)0x0)) {
    prevState._4_4_ = 0.0;
    if (((ConsoleState == c_up) && (menuactive != MENU_On)) && ((level.flags2 & 0x20) == 0)) {
      fVar3 = GetTimeFloat();
      prevState._4_4_ = fVar3 - (float)(int)fVar3;
    }
    nextState = (FState *)
                ((double)((float)(curState->Tics - curTics) - prevState._4_4_) /
                (double)(int)curState->Tics);
    if (0.0 <= (double)nextState) {
      if ((smf->flags & 8) != 0) {
        if ((curState->sprite == curState[-1].sprite) && (curState->Frame == curState[-1].Frame)) {
          nextState = (FState *)((double)nextState / 2.0 + 0.5);
        }
        if ((curState->sprite == _time->sprite) && (curState->Frame == _time->Frame)) {
          nextState = (FState *)((double)nextState / 2.0);
          _time = FState::GetNextState(_time);
        }
      }
      if (((double)nextState != 0.0) || (NAN((double)nextState))) {
        inter = (double)gl_FindModelFrame(ti,(uint)_time->sprite,(uint)_time->Frame,false);
      }
    }
    else {
      nextState = (FState *)0x0;
    }
  }
  for (mdl._4_4_ = 0; mdl._4_4_ < 4; mdl._4_4_ = mdl._4_4_ + 1) {
    if (smf->modelIDs[mdl._4_4_] != -1) {
      ppFVar2 = TArray<FModel_*,_FModel_*>::operator[]
                          (&Models.super_TArray<FModel_*,_FModel_*>,(long)smf->modelIDs[mdl._4_4_]);
      this = *ppFVar2;
      bVar1 = FTextureID::isValid(smf->skinIDs + mdl._4_4_);
      if (bVar1) {
        local_88 = FTextureManager::operator()
                             (&TexMan,(FTextureID)smf->skinIDs[mdl._4_4_].texnum,false);
      }
      else {
        local_88 = (FTexture *)0x0;
      }
      (*this->_vptr_FModel[5])();
      FRenderState::SetVertexBuffer(&gl_RenderState,&this->mVBuf->super_FVertexBuffer);
      FModel::PushSpriteMDLFrame(this,smf,mdl._4_4_);
      if ((inter == 0.0) ||
         (smf->modelframes[mdl._4_4_] == *(int *)((long)inter + 0x220 + (long)mdl._4_4_ * 4))) {
        (*this->_vptr_FModel[4])
                  (0,this,local_88,(ulong)(uint)smf->modelframes[mdl._4_4_],
                   (ulong)(uint)smf->modelframes[mdl._4_4_],(ulong)(uint)translation);
      }
      else {
        (*this->_vptr_FModel[4])
                  (nextState,this,local_88,(ulong)(uint)smf->modelframes[mdl._4_4_],
                   (ulong)*(uint *)((long)inter + 0x220 + (long)mdl._4_4_ * 4),
                   (ulong)(uint)translation);
      }
      FRenderState::SetVertexBuffer(&gl_RenderState,&GLRenderer->mVBO->super_FVertexBuffer);
    }
  }
  return;
}

Assistant:

void gl_RenderFrameModels( const FSpriteModelFrame *smf,
						   const FState *curState,
						   const int curTics,
						   const PClass *ti,
						   Matrix3x4 *normaltransform,
						   int translation)
{
	// [BB] Frame interpolation: Find the FSpriteModelFrame smfNext which follows after smf in the animation
	// and the scalar value inter ( element of [0,1) ), both necessary to determine the interpolated frame.
	FSpriteModelFrame * smfNext = nullptr;
	double inter = 0.;
	if( gl_interpolate_model_frames && !(smf->flags & MDL_NOINTERPOLATION) )
	{
		FState *nextState = curState->GetNextState( );
		if( curState != nextState && nextState )
		{
			// [BB] To interpolate at more than 35 fps we take tic fractions into account.
			float ticFraction = 0.;
			// [BB] In case the tic counter is frozen we have to leave ticFraction at zero.
			if ( ConsoleState == c_up && menuactive != MENU_On && !(level.flags2 & LEVEL2_FROZEN) )
			{
				float time = GetTimeFloat();
				ticFraction = (time - static_cast<int>(time));
			}
			inter = static_cast<double>(curState->Tics - curTics - ticFraction)/static_cast<double>(curState->Tics);

			// [BB] For some actors (e.g. ZPoisonShroom) spr->actor->tics can be bigger than curState->Tics.
			// In this case inter is negative and we need to set it to zero.
			if ( inter < 0. )
				inter = 0.;
			else
			{
				// [BB] Workaround for actors that use the same frame twice in a row.
				// Most of the standard Doom monsters do this in their see state.
				if ( (smf->flags & MDL_INTERPOLATEDOUBLEDFRAMES) )
				{
					const FState *prevState = curState - 1;
					if ( (curState->sprite == prevState->sprite) && ( curState->Frame == prevState->Frame) )
					{
						inter /= 2.;
						inter += 0.5;
					}
					if ( (curState->sprite == nextState->sprite) && ( curState->Frame == nextState->Frame) )
					{
						inter /= 2.;
						nextState = nextState->GetNextState( );
					}
				}
				if ( inter != 0.0 )
					smfNext = gl_FindModelFrame(ti, nextState->sprite, nextState->Frame, false);
			}
		}
	}

	for(int i=0; i<MAX_MODELS_PER_FRAME; i++)
	{
		if (smf->modelIDs[i] != -1)
		{
			FModel * mdl = Models[smf->modelIDs[i]];
			FTexture *tex = smf->skinIDs[i].isValid()? TexMan(smf->skinIDs[i]) : nullptr;
			mdl->BuildVertexBuffer();
			gl_RenderState.SetVertexBuffer(mdl->mVBuf);

			mdl->PushSpriteMDLFrame(smf, i);

			if ( smfNext && smf->modelframes[i] != smfNext->modelframes[i] )
				mdl->RenderFrame(tex, smf->modelframes[i], smfNext->modelframes[i], inter, translation);
			else
				mdl->RenderFrame(tex, smf->modelframes[i], smf->modelframes[i], 0.f, translation);

			gl_RenderState.SetVertexBuffer(GLRenderer->mVBO);
		}
	}
}